

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itersolv.c
# Opt level: O0

Vector * JacobiIter(QMatrix *A,Vector *x,Vector *b,int MaxIter,PrecondProcType Dummy,double Omega)

{
  LASErrIdType LVar1;
  Boolean BVar2;
  Vector *pVVar3;
  QMatrix *Q;
  double bNorm_00;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 local_80 [8];
  Vector r;
  size_t Dim;
  double bNorm;
  int Iter;
  double Omega_local;
  PrecondProcType Dummy_local;
  int MaxIter_local;
  Vector *b_local;
  Vector *x_local;
  QMatrix *A_local;
  
  Q_Lock(A);
  V_Lock(x);
  V_Lock(b);
  r.Cmp = (Real *)Q_GetDim(A);
  V_Constr((Vector *)local_80,"r",(size_t)r.Cmp,Normal,True);
  LVar1 = LASResult();
  if (LVar1 == LASOK) {
    bNorm_00 = l2Norm_V(b);
    bNorm._4_4_ = 0;
    dVar4 = l1Norm_V(x);
    auVar5._8_4_ = (int)((ulong)r.Cmp >> 0x20);
    auVar5._0_8_ = r.Cmp;
    auVar5._12_4_ = 0x45300000;
    if (ABS(dVar4 / ((auVar5._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)r.Cmp) - 4503599627370496.0))) <
        2.2250738585072014e-307) {
      Asgn_VV((Vector *)local_80,b);
    }
    else {
      BVar2 = Q_KerDefined(A);
      if (BVar2 != False) {
        OrthoRightKer_VQ(x,A);
      }
      pVVar3 = Mul_QV(A,x);
      pVVar3 = Sub_VV(b,pVVar3);
      Asgn_VV((Vector *)local_80,pVVar3);
    }
    while( true ) {
      dVar4 = l2Norm_V((Vector *)local_80);
      BVar2 = RTCResult(bNorm._4_4_,dVar4,bNorm_00,JacobiIterId);
      if (BVar2 != False || MaxIter <= bNorm._4_4_) break;
      bNorm._4_4_ = bNorm._4_4_ + 1;
      Q = Diag_Q(A);
      pVVar3 = MulInv_QV(Q,(Vector *)local_80);
      pVVar3 = Mul_SV(Omega,pVVar3);
      AddAsgn_VV(x,pVVar3);
      BVar2 = Q_KerDefined(A);
      if (BVar2 != False) {
        OrthoRightKer_VQ(x,A);
      }
      if (bNorm._4_4_ < MaxIter) {
        pVVar3 = Mul_QV(A,x);
        pVVar3 = Sub_VV(b,pVVar3);
        Asgn_VV((Vector *)local_80,pVVar3);
      }
    }
  }
  V_Destr((Vector *)local_80);
  Q_Unlock(A);
  V_Unlock(x);
  V_Unlock(b);
  return x;
}

Assistant:

Vector *JacobiIter(QMatrix *A, Vector *x, Vector *b, int MaxIter,
            PrecondProcType Dummy, double Omega)
{
    (void) Dummy;

    int Iter;
    double bNorm;
    size_t Dim;
    Vector r;

    Q_Lock(A);
    V_Lock(x);
    V_Lock(b);
    
    Dim = Q_GetDim(A);
    V_Constr(&r, "r", Dim, Normal, True);

    if (LASResult() == LASOK) {
        bNorm = l2Norm_V(b);

        Iter = 0;
        /* r = b - A * x(i) */
        if (!IsZero(l1Norm_V(x) / Dim)) {
            if (Q_KerDefined(A))
	       OrthoRightKer_VQ(x, A);
            Asgn_VV(&r, Sub_VV(b, Mul_QV(A, x)));
        } else {
            Asgn_VV(&r, b);
	}
        while (!RTCResult(Iter, l2Norm_V(&r), bNorm, JacobiIterId)
            && Iter < MaxIter) {
            Iter++;
            /* x(i+1) = x(i) + Omega * D^(-1) * r */
            AddAsgn_VV(x, Mul_SV(Omega, MulInv_QV(Diag_Q(A), &r)));
            if (Q_KerDefined(A))
	       OrthoRightKer_VQ(x, A);
            /* r = b - A * x(i) */
            if (Iter < MaxIter)
                Asgn_VV(&r, Sub_VV(b, Mul_QV(A, x)));
        }
    }

    V_Destr(&r);

    Q_Unlock(A);
    V_Unlock(x);
    V_Unlock(b);

    return(x);
}